

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::RandJoinClauseSyntax::setChild
          (RandJoinClauseSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  logic_error *this_00;
  Token TVar2;
  ParenthesizedExpressionSyntax *local_138;
  string local_110;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  RandJoinClauseSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  if (index == 0) {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar2._0_8_;
    (this->rand).kind = (undefined2)local_28;
    (this->rand).field_0x2 = local_28._2_1_;
    (this->rand).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->rand).rawLen = local_28._4_4_;
    local_20 = TVar2.info;
    (this->rand).info = local_20;
  }
  else if (index == 1) {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar2._0_8_;
    (this->join).kind = (undefined2)local_38;
    (this->join).field_0x2 = local_38._2_1_;
    (this->join).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->join).rawLen = local_38._4_4_;
    local_30 = TVar2.info;
    (this->join).info = local_30;
  }
  else {
    if (index != 2) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
                 ,&local_d9);
      std::operator+(&local_b8,&local_d8,":");
      std::__cxx11::to_string(&local_110,0x2aaf);
      std::operator+(&local_98,&local_b8,&local_110);
      std::operator+(&local_78,&local_98,": ");
      std::operator+(&local_58,&local_78,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_58);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_138 = (ParenthesizedExpressionSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_138 = SyntaxNode::as<slang::syntax::ParenthesizedExpressionSyntax>(pSVar1);
    }
    this->expr = local_138;
  }
  return;
}

Assistant:

void RandJoinClauseSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: rand = child.token(); return;
        case 1: join = child.token(); return;
        case 2: expr = child.node() ? &child.node()->as<ParenthesizedExpressionSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}